

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

float * hdr_load(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  char *__s1;
  long lVar8;
  stbi_uc local_488;
  undefined1 local_487;
  undefined1 local_486;
  undefined1 local_485;
  stbi_uc local_484 [4];
  stbi_uc rgbe_1 [4];
  stbi_uc rgbe [4];
  int z;
  int c2;
  int c1;
  int k;
  int j;
  int i;
  uchar value;
  uchar count;
  int len;
  float *hdr_data;
  stbi_uc *scanline;
  int height;
  int width;
  int valid;
  char *token;
  char buffer [1024];
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi *s_local;
  
  bVar1 = false;
  buffer._1020_4_ = req_comp;
  __s1 = hdr_gettoken(s,(char *)&token);
  iVar2 = strcmp(__s1,"#?RADIANCE");
  if (iVar2 == 0) {
    while (_width = hdr_gettoken(s,(char *)&token), *_width != '\0') {
      iVar2 = strcmp(_width,"FORMAT=32-bit_rle_rgbe");
      if (iVar2 == 0) {
        bVar1 = true;
      }
    }
    if (bVar1) {
      _width = hdr_gettoken(s,(char *)&token);
      iVar2 = strncmp(_width,"-Y ",3);
      if (iVar2 == 0) {
        _width = _width + 3;
        lVar8 = strtol(_width,(char **)&width,10);
        iVar2 = (int)lVar8;
        for (; *_width == ' '; _width = _width + 1) {
        }
        iVar3 = strncmp(_width,"+X ",3);
        if (iVar3 == 0) {
          _width = _width + 3;
          lVar8 = strtol(_width,(char **)0x0,10);
          uVar4 = (uint)lVar8;
          *x = uVar4;
          *y = iVar2;
          *comp = 3;
          if (buffer._1020_4_ == 0) {
            buffer[0x3fc] = '\x03';
            buffer[0x3fd] = '\0';
            buffer[0x3fe] = '\0';
            buffer[0x3ff] = '\0';
          }
          s_local = (stbi *)malloc((long)(int)(iVar2 * uVar4 * buffer._1020_4_) << 2);
          if (((int)uVar4 < 8) || (0x7fff < (int)uVar4)) {
            c1 = 0;
            goto LAB_0015ccbb;
          }
          hdr_data = (float *)0x0;
          for (c1 = 0; c1 < iVar2; c1 = c1 + 1) {
            iVar3 = get8(s);
            iVar5 = get8(s);
            uVar6 = get8(s);
            if (((iVar3 != 2) || (iVar5 != 2)) || ((uVar6 & 0x80) != 0)) {
              local_488 = (stbi_uc)iVar3;
              local_487 = (undefined1)iVar5;
              local_486 = (undefined1)uVar6;
              iVar3 = get8(s);
              local_485 = (undefined1)iVar3;
              hdr_convert((float *)s_local,&local_488,buffer._1020_4_);
              k = 1;
              c1 = 0;
              free(hdr_data);
              do {
                getn(s,local_484,4);
                hdr_convert((float *)(&s_local->img_x +
                                     (long)(int)(c1 * uVar4 * buffer._1020_4_) +
                                     (long)(k * buffer._1020_4_)),local_484,buffer._1020_4_);
                k = k + 1;
                while ((int)uVar4 <= k) {
                  c1 = c1 + 1;
LAB_0015ccbb:
                  if (iVar2 <= c1) {
                    return (float *)s_local;
                  }
                  k = 0;
                }
              } while( true );
            }
            uVar7 = get8(s);
            if ((uVar7 | uVar6 << 8) != uVar4) {
              free(s_local);
              free(hdr_data);
              e("corrupt HDR");
              return (float *)0x0;
            }
            if (hdr_data == (float *)0x0) {
              hdr_data = (float *)malloc((long)(int)(uVar4 << 2));
            }
            for (c2 = 0; c2 < 4; c2 = c2 + 1) {
              k = 0;
              while (k < (int)uVar4) {
                uVar6 = get8(s);
                if ((byte)uVar6 < 0x81) {
                  rgbe_1[0] = '\0';
                  rgbe_1[1] = '\0';
                  rgbe_1[2] = '\0';
                  rgbe_1[3] = '\0';
                  for (; (int)rgbe_1 < (int)(uVar6 & 0xff); rgbe_1 = (stbi_uc  [4])((int)rgbe_1 + 1)
                      ) {
                    iVar3 = get8(s);
                    *(char *)((long)hdr_data + (long)(k * 4 + c2)) = (char)iVar3;
                    k = k + 1;
                  }
                }
                else {
                  iVar3 = get8(s);
                  rgbe_1[0] = '\0';
                  rgbe_1[1] = '\0';
                  rgbe_1[2] = '\0';
                  rgbe_1[3] = '\0';
                  for (; (int)rgbe_1 < (int)(uint)(byte)((byte)uVar6 + 0x80);
                      rgbe_1 = (stbi_uc  [4])((int)rgbe_1 + 1)) {
                    *(char *)((long)hdr_data + (long)(k * 4 + c2)) = (char)iVar3;
                    k = k + 1;
                  }
                }
              }
            }
            for (k = 0; k < (int)uVar4; k = k + 1) {
              hdr_convert((float *)(&s_local->img_x + (int)((c1 * uVar4 + k) * buffer._1020_4_)),
                          (stbi_uc *)((long)hdr_data + (long)(k << 2)),buffer._1020_4_);
            }
          }
          free(hdr_data);
        }
        else {
          e("Unsupported HDR format");
          s_local = (stbi *)0x0;
        }
      }
      else {
        e("Unsupported HDR format");
        s_local = (stbi *)0x0;
      }
    }
    else {
      e("Unsupported HDR format");
      s_local = (stbi *)0x0;
    }
  }
  else {
    e("Corrupt HDR image");
    s_local = (stbi *)0x0;
  }
  return (float *)s_local;
}

Assistant:

static float *hdr_load(stbi *s, int *x, int *y, int *comp, int req_comp)
{
   char buffer[HDR_BUFLEN];
	char *token;
	int valid = 0;
	int width, height;
   stbi_uc *scanline;
	float *hdr_data;
	int len;
	unsigned char count, value;
	int i, j, k, c1,c2, z;


	// Check identifier
	if (strcmp(hdr_gettoken(s,buffer), "#?RADIANCE") != 0)
		return epf("not HDR", "Corrupt HDR image");

	// Parse header
	while(1) {
		token = hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
		if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

	if (!valid)    return epf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return epf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return epf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = strtol(token, NULL, 10);

	*x = width;
	*y = height;

   *comp = 3;
	if (req_comp == 0) req_comp = 3;

	// Read data
	hdr_data = (float *) malloc(height * width * req_comp * sizeof(float));

	// Load image data
   // image data is stored as some number of sca
	if( width < 8 || width >= 32768) {
		// Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            getn(s, rgbe, 4);
            hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
	} else {
		// Read RLE-encoded data
		scanline = NULL;

		for (j = 0; j < height; ++j) {
         c1 = get8(s);
         c2 = get8(s);
         len = get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4] = { c1,c2,len, get8(s) };
            hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            free(scanline);
            goto main_decode_loop; // yes, this is fucking insane; blame the fucking insane format
         }
         len <<= 8;
         len |= get8(s);
         if (len != width) { free(hdr_data); free(scanline); return epf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) scanline = (stbi_uc *) malloc(width * 4);

			for (k = 0; k < 4; ++k) {
				i = 0;
				while (i < width) {
					count = get8(s);
					if (count > 128) {
						// Run
						value = get8(s);
                  count -= 128;
						for (z = 0; z < count; ++z)
							scanline[i++ * 4 + k] = value;
					} else {
						// Dump
						for (z = 0; z < count; ++z)
							scanline[i++ * 4 + k] = get8(s);
					}
				}
			}
         for (i=0; i < width; ++i)
            hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
		}
      free(scanline);
	}

   return hdr_data;
}